

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<duckdb::Value,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::Value,_true> *ret)

{
  undefined8 in_RDX;
  undefined2 in_SI;
  vector<duckdb::Value,_true> *in_RDI;
  undefined6 in_stack_00000038;
  vector<duckdb::Value,_true> *in_stack_ffffffffffffffb8;
  
  (**(code **)((in_RDI->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start + 0x10))(in_RDI,in_SI,in_RDX,in_SI);
  Read<duckdb::vector<duckdb::Value,true>>((Deserializer *)CONCAT26(field_id,in_stack_00000038));
  vector<duckdb::Value,_true>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x9c98d0);
  (**(code **)((in_RDI->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start + 0x18))();
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}